

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
               (RecyclableObject *instance,uint32 index,Var *setterValue,DescriptorFlags *flags,
               ScriptContext *scriptContext,BOOL skipPrototypeCheck)

{
  code *pcVar1;
  bool bVar2;
  DescriptorFlags DVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  if (setterValue == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x986,"(setterValue)","setterValue");
    if (!bVar2) goto LAB_0099a3b4;
    *puVar4 = 0;
  }
  if (flags == (DescriptorFlags *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x987,"(flags)","flags");
    if (!bVar2) {
LAB_0099a3b4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance);
  if (bVar2) {
    uVar5 = 0;
  }
  else {
    while (((instance->type).ptr)->typeId != TypeIds_Null) {
      DVar3 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x28])(instance,(ulong)index,setterValue,scriptContext)
      ;
      *flags = DVar3;
      if (DVar3 != None || skipPrototypeCheck != 0) goto LAB_0099a38a;
      instance = RecyclableObject::GetPrototype(instance);
    }
    DVar3 = *flags;
LAB_0099a38a:
    uVar5 = 0;
    if ((DVar3 & (Proxy|Accessor)) == None) {
      if ((DVar3 & Data) != None) {
        uVar5 = (uint)((DVar3 & Writable) == None);
      }
    }
    else {
      uVar5 = 1;
    }
  }
  return uVar5;
}

Assistant:

BOOL JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(RecyclableObject* instance, uint32 index,
        Var* setterValue, DescriptorFlags *flags, ScriptContext* scriptContext, BOOL skipPrototypeCheck /* = FALSE */)
    {
        Assert(setterValue);
        Assert(flags);

        // Do a quick walk up the prototype chain to see if any of the prototypes has ever had ANY setter or non-writable property.
        if (CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance))
        {
            return FALSE;
        }

        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            *flags = object->GetItemSetter(index, setterValue, scriptContext);
            if (*flags != None || skipPrototypeCheck)
            {
                break;
            }
            object = object->GetPrototype();
        }

        return ((*flags & Accessor) == Accessor) || ((*flags & Proxy) == Proxy) || ((*flags & Data) == Data && (*flags & Writable) == None);
    }